

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
          (SubscriptionSync *this,SubscriptionSync *to_move)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_PixieMessage)._vptr_PixieMessage = (_func_int **)&PTR_Encode_001e7a20;
  this->options_ = 0;
  p_Var1 = &(this->controls_)._M_t._M_impl.super__Rb_tree_header;
  (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->controls_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->subjects_).
  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subjects_).
  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subjects_).
  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->edition_ = to_move->edition_;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::operator=(&this->subjects_,&to_move->subjects_);
  this->size_ = to_move->size_;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::operator=(&(this->controls_)._M_t,&(to_move->controls_)._M_t);
  this->options_ = to_move->options_;
  return;
}

Assistant:

SubscriptionSync::SubscriptionSync(const SubscriptionSync&& to_move)
{
    edition_ = to_move.edition_;
    subjects_ = std::move(to_move.subjects_);
    size_ = to_move.size_;
    controls_ = std::move(to_move.controls_);
    options_ = to_move.options_;
}